

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O3

void game_run(_func_void *eventpoll,_func_void *draw)

{
  vec2i vVar1;
  vec2i v;
  long lVar2;
  vec2i *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  cell_type cVar7;
  size_t i;
  time_t tVar8;
  long lVar9;
  vec2i *pvVar10;
  uint uVar11;
  uint uVar13;
  ulong uVar12;
  ulong uVar14;
  
  iVar4 = SDL_GetTicks();
  do {
    while (g.state == INIT) {
      tVar8 = time((time_t *)0x0);
      srand((uint)tVar8);
      iVar5 = rand();
      g.dir = iVar5 % 4;
      iVar5 = rand();
      iVar5 = iVar5 % ui_cols;
      iVar6 = rand();
      g.food.y = iVar6 % ui_rows;
      g.snake.len = 0;
      g.food.x = iVar5;
      iVar6 = rand();
      iVar5 = ui_cols + 3;
      if (-1 < ui_cols) {
        iVar5 = ui_cols;
      }
      uVar13 = (iVar5 >> 2) + iVar6 % (ui_cols / 2);
      uVar14 = (ulong)uVar13;
      iVar6 = rand();
      iVar5 = ui_rows + 3;
      if (-1 < ui_rows) {
        iVar5 = ui_rows;
      }
      uVar11 = (iVar5 >> 2) + iVar6 % (ui_rows / 2);
      uVar12 = (ulong)uVar11;
      vVar1.y = uVar11;
      vVar1.x = uVar13;
      snake_push(vVar1);
      switch(g.dir) {
      case UP:
        uVar12 = (ulong)(uVar11 + 1);
        break;
      case RIGHT:
        uVar14 = (ulong)(uVar13 - 1);
        break;
      case DOWN:
        uVar12 = (ulong)(uVar11 - 1);
        break;
      case LEFT:
        uVar14 = (ulong)(uVar13 + 1);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iostapyshyn[P]snakerl/game.c"
                      ,0x4a,"void game_init()");
      }
      snake_push((vec2i)(uVar14 | uVar12 << 0x20));
      g.state = MENU;
    }
    if (g.state == QUIT) {
      g.state = QUIT;
      free(g.snake.seg);
      return;
    }
    (*eventpoll)();
    if (g.state == RUNNING) {
      iVar5 = SDL_GetTicks();
      if ((force_update != '\0') || (levels[g.level].update_ms < (uint)(iVar5 - iVar4))) {
        force_update = '\0';
        vVar1 = g.snake.seg[(long)g.snake.len + -1];
        lVar9 = (long)g.snake.len + -1;
        if ((int)lVar9 != 0) {
          do {
            g.snake.seg[lVar9] = g.snake.seg[lVar9 + -1];
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        pvVar3 = g.snake.seg;
        pvVar10 = g.snake.seg;
        switch(g.dir) {
        case UP:
          iVar4 = -1;
          pvVar10 = (vec2i *)&(g.snake.seg)->y;
          break;
        case RIGHT:
          iVar4 = 1;
          break;
        case DOWN:
          iVar4 = 1;
          pvVar10 = (vec2i *)&(g.snake.seg)->y;
          break;
        case LEFT:
          iVar4 = -1;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iostapyshyn[P]snakerl/game.c"
                        ,0x60,"void game_update()");
        }
        pvVar10->x = pvVar10->x + iVar4;
        v = *pvVar3;
        cVar7 = cell_gettype(v);
        iVar4 = iVar5;
        if (cVar7 == WALL) {
          if (levels[g.level].wall_collisions == false) {
            iVar5 = v.x;
            if (iVar5 < 0 || ui_cols <= iVar5) {
              iVar5 = ui_cols + iVar5;
              pvVar3->x = iVar5;
              pvVar3->x = iVar5 % ui_cols;
            }
            if ((long)v < 0 || ui_rows <= v.y) {
              pvVar3->y = (v.y + ui_rows) % ui_rows;
            }
            cVar7 = cell_gettype(*pvVar3);
            goto LAB_00102ab6;
          }
        }
        else {
LAB_00102ab6:
          if ((cVar7 != SNAKE) && ((cVar7 != WALL || (levels[g.level].wall_collisions == false)))) {
            if (cVar7 == FOOD) {
              snake_push(vVar1);
              do {
                iVar5 = rand();
                lVar9 = (long)ui_cols;
                iVar6 = rand();
                lVar2 = (long)ui_rows;
                cVar7 = cell_gettype((vec2i)(((long)iVar5 % lVar9 & 0xffffffffU) +
                                            ((long)iVar6 % lVar2 << 0x20)));
              } while (cVar7 != EMPTY);
              g.food.x = (int32_t)((long)iVar5 % lVar9);
              g.food.y = (int32_t)((long)iVar6 % lVar2);
            }
            goto LAB_00102ae6;
          }
        }
        g.state = LOST;
      }
    }
    else if (g.state == MENU) {
      if (g.level < 3) {
        if (g.level < 0) {
          g.level = 2;
        }
      }
      else {
        g.level = 0;
      }
    }
LAB_00102ae6:
    (*draw)();
  } while( true );
}

Assistant:

void game_run(void (*eventpoll)(void), void (*draw)(void)) {
    uint32_t last_ticks = SDL_GetTicks();
    while (g.state != QUIT) {
        if (g.state == INIT) {
            game_init();
            continue;
        }
        
        eventpoll();

        if (g.state == MENU) {
            if ((signed int) g.level > nlevels-1)
                g.level = 0;
            else if ((signed int) g.level < 0)
                g.level = nlevels-1;
        } else if (g.state == RUNNING) {
            uint32_t now_ticks = SDL_GetTicks();
            if (force_update || now_ticks - last_ticks > levels[g.level].update_ms) {
                /* Update. */
                force_update = false;
                last_ticks = now_ticks;
                game_update();
            }
        }

        draw();
    }

    game_quit();
}